

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::SetParameters(EpochTracker *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x160) = 0x3ba3d70a;
  *(undefined1 *)(in_RDI + 0x170) = 1;
  *(undefined1 *)(in_RDI + 0x171) = 0;
  *(undefined4 *)(in_RDI + 0x16c) = 0x43fa0000;
  *(undefined4 *)(in_RDI + 0x168) = 0x42200000;
  *(undefined4 *)(in_RDI + 0x164) = 0x3c23d70a;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x140),"");
  *(undefined4 *)(in_RDI + 0x174) = 0x3b03126f;
  *(undefined4 *)(in_RDI + 0x178) = 0x42a00000;
  *(undefined4 *)(in_RDI + 0x17c) = 0x3d4ccccd;
  *(undefined4 *)(in_RDI + 0x180) = 0x3ca3d70a;
  *(undefined4 *)(in_RDI + 0x184) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x188) = 0x3f7ae148;
  *(undefined4 *)(in_RDI + 0x18c) = 0x428c0000;
  *(undefined4 *)(in_RDI + 400) = 0x39d1b717;
  *(undefined4 *)(in_RDI + 0x194) = 0x391d4952;
  *(undefined4 *)(in_RDI + 0x198) = 0x3dcccccd;
  *(undefined4 *)(in_RDI + 0x19c) = 0x3e99999a;
  *(undefined4 *)(in_RDI + 0x1a0) = 0x3dcccccd;
  *(undefined4 *)(in_RDI + 0x1a4) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x1a8) = 0x3ca3d70a;
  *(undefined4 *)(in_RDI + 0x1ac) = 0x41f00000;
  *(undefined4 *)(in_RDI + 0x1b0) = 0x41a00000;
  *(undefined4 *)(in_RDI + 0x1b4) = 0x3ca3d70a;
  *(undefined4 *)(in_RDI + 0x1b8) = 0x42c80000;
  *(undefined4 *)(in_RDI + 0x1bc) = 0x447a0000;
  *(undefined4 *)(in_RDI + 0x1c0) = 0x3ccccccd;
  *(undefined4 *)(in_RDI + 0x1c4) = 0x3bf5c28f;
  *(undefined4 *)(in_RDI + 0x1c8) = 0x3e4ccccd;
  *(undefined4 *)(in_RDI + 0x1cc) = 0xbfc00000;
  *(undefined4 *)(in_RDI + 0x1d0) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x1d4) = 0x3fa66666;
  *(undefined4 *)(in_RDI + 0x1d8) = 0x3f666666;
  *(undefined4 *)(in_RDI + 0x1dc) = 0x3f666666;
  *(undefined4 *)(in_RDI + 0x1e0) = 0x3951b717;
  *(undefined4 *)(in_RDI + 0x1e4) = 0x3f4ccccd;
  *(undefined4 *)(in_RDI + 0x1e8) = 0x3fe66666;
  *(undefined4 *)(in_RDI + 0x1ec) = 0x3fb33333;
  *(undefined4 *)(in_RDI + 0x1f0) = 0x3c23d70a;
  return;
}

Assistant:

void EpochTracker::SetParameters(void) {
  // Externally-settable control parameters:
  // Period for the returned F0 signal.
  external_frame_interval_ = kExternalFrameInterval;
  do_highpass_ = kDoHighpass;  // Enables highpassing of input signal.
  // Enables Hilbert transformation of the input data.
  do_hilbert_transform_ = kDoHilbertTransform;
  max_f0_search_ = kMaxF0Search;  // Maximum F0 to search for.
  min_f0_search_ = kMinF0Search;  // Minimum F0 to search for.
  // Pulse spacing to use in unvoiced regions of the returned epoch signal.
  unvoiced_pulse_interval_ = kUnvoicedPulseInterval;
  debug_name_ = kDebugName;  // base path for all debugging signals.

  // Internal feature-computation parameters:
  // For internal feature computations
  internal_frame_interval_ = kInternalFrameInterval;
  // for the high-pass filter
  corner_frequency_ = 80.0;
  filter_duration_ = 0.05;
  // for the LPC inverse filter.
  frame_duration_ = 0.02;  // window size (sec)
  lpc_frame_interval_ = 0.01;  // (sec)
  preemphasis_ = 0.98;  // preemphasis for LPC analysis
  noise_floor_ = 70.0;  // SNR in dB simulated during LPC analysis.
  // for computing LPC residual peak quality.
  peak_delay_ = 0.0004;  // for measuring prominence
  skew_delay_ = 0.00015;  // for measuring shape
  peak_val_wt_ = 0.1;
  peak_prominence_wt_ = 0.3;
  peak_skew_wt_ = 0.1;
  peak_quality_floor_ = 0.01;
  // for computing voice-transition pseudo-probabilities
  time_span_ = 0.020;  // the interval (sec) centered on the
  // measurement point, used to compute parameter
  // deltas.
  level_change_den_ = 30.0;  // max. dB level change expected over
  // time_span_ for bandpassed RMS for
  // computing pseudo-probability of
  // voicing.
  min_rms_db_ = 20.0;  // level floor in dB
  // window size for computing amplitude-normalizing RMS
  ref_dur_ = 0.02;
  // low and high frequency limits for bandpassed RMS used in voicing indicator
  min_freq_for_rms_ = 100.0;
  max_freq_for_rms_ = 1000.0;
  // duration of integrator for bandpassed RMS
  rms_window_dur_ = 0.025;
  // window duration, in seconds, for NCCF computations
  correlation_dur_ = 0.0075;
  // ignore any NCCF peaks less than this
  correlation_thresh_ = 0.2;

  // Parametrs used by the dynamic-programming tracker:
  // reward for inserting another period
  reward_ = -1.5;
  // weight given to deviation of inter-pulse interval from the
  // closest NCCF peak lag
  period_deviation_wt_ = 1.0;
  // weight given to the quality of the residual peak
  peak_quality_wt_ = 1.3;
  // cost of the unvoiced hypothesis
  unvoiced_cost_ = kUnvoicedCost;
  // cost of high NCCF values in hypothetical unvoiced regions
  nccf_uv_peak_wt_ = 0.9;
  // weight given to period length
  period_wt_ = 0.0002;
  // weight given to the pseudo-probability of voicing feature
  level_wt_ = 0.8;
  // weight given to period-length differences between adjacent periods.
  freq_trans_wt_ = 1.8;
  // cost of switching between voicing states; modulated by voicing
  // onset/offset probs.
  voice_transition_factor_ = 1.4;

  // Parameters used to generate final outputs:
  // pad time in seconds to add to the last measured period during
  // output of periodically-resampled data
  endpoint_padding_ = 0.01;
}